

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O1

void __thiscall JUnitTestOutput::writeTestGroupToFile(JUnitTestOutput *this)

{
  SimpleString local_20;
  
  (*(this->super_TestOutput)._vptr_TestOutput[0x17])(&local_20,this,&(this->impl_->results_).group_)
  ;
  (*(this->super_TestOutput)._vptr_TestOutput[0x18])(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1c])(this);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1d])(this);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1e])(this);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1f])(this);
  (*(this->super_TestOutput)._vptr_TestOutput[0x23])(this);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1b])(this);
  return;
}

Assistant:

void JUnitTestOutput::writeTestGroupToFile()
{
    openFileForWrite(createFileName(impl_->results_.group_));
    writeXmlHeader();
    writeTestSuiteSummary();
    writeProperties();
    writeTestCases();
    writeFileEnding();
    closeFile();
}